

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O3

void anon_unknown.dwarf_3983::test_add_many(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *prVar2;
  long lVar3;
  uint64_t i;
  uint64_t uVar4;
  uint64_t uVar5;
  array<unsigned_long,_1000UL> vals;
  uint64_t local_1f60 [1000];
  
  prVar2 = roaring64_bitmap_create();
  uVar4 = 0;
  uVar5 = 1;
  lVar3 = 0;
  do {
    local_1f60[lVar3] = uVar4;
    local_1f60[lVar3 + 1] = uVar5;
    lVar3 = lVar3 + 2;
    uVar4 = uVar4 + 2;
    uVar5 = uVar5 + 2;
  } while (lVar3 != 1000);
  roaring64_bitmap_add_many(prVar2,1000,local_1f60);
  assert_r64_valid((roaring64_bitmap_t *)prVar2);
  lVar3 = 0;
  do {
    _Var1 = roaring64_bitmap_contains(prVar2,local_1f60[lVar3]);
    _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, vals[i])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                 ,0xd2);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 1000);
  roaring64_bitmap_free(prVar2);
  prVar2 = roaring64_bitmap_create();
  local_1f60[0] = 0;
  roaring64_bitmap_add(prVar2,0);
  _Var1 = roaring64_bitmap_contains(prVar2,0);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, value)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xdd);
  roaring64_bitmap_add_many(prVar2,1,local_1f60);
  assert_r64_valid((roaring64_bitmap_t *)prVar2);
  _Var1 = roaring64_bitmap_contains(prVar2,local_1f60[0]);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, value)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xe0);
  uVar4 = roaring64_bitmap_get_cardinality(prVar2);
  _assert_int_equal(uVar4,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0xe1);
  roaring64_bitmap_free(prVar2);
  return;
}

Assistant:

DEFINE_TEST(test_add_many) {
    {
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        std::array<uint64_t, 1000> vals;
        std::iota(vals.begin(), vals.end(), 0);

        roaring64_bitmap_add_many(r, vals.size(), vals.data());
        assert_r64_valid(r);
        for (uint64_t i = 0; i < 1000; ++i) {
            assert_true(roaring64_bitmap_contains(r, vals[i]));
        }

        roaring64_bitmap_free(r);
    }

    {
        // Add many_where value already exists
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        uint64_t value = 0;
        roaring64_bitmap_add(r, value);
        assert_true(roaring64_bitmap_contains(r, value));
        roaring64_bitmap_add_many(r, 1, &value);
        assert_r64_valid(r);
        assert_true(roaring64_bitmap_contains(r, value));
        assert_int_equal(roaring64_bitmap_get_cardinality(r), 1);
        roaring64_bitmap_free(r);
    }
}